

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::char_writer::operator()
          (char_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  char_writer cVar1;
  char_writer *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  cVar1 = *this;
  pcVar2 = (char_writer *)(it->super_truncating_iterator_base<char_*>).out_;
  uVar3 = (it->super_truncating_iterator_base<char_*>).count_;
  uVar4 = (it->super_truncating_iterator_base<char_*>).limit_;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_>::operator++(it);
  if (uVar3 < uVar4) {
    *pcVar2 = cVar1;
  }
  return;
}

Assistant:

void operator()(It &&it) const { *it++ = value; }